

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Statement * __thiscall soul::StructuralParser::parseForLoop(StructuralParser *this)

{
  bool bVar1;
  Block *pBVar2;
  LoopStatement *pLVar3;
  Statement *pSVar4;
  VariableDeclaration *pVVar5;
  Constant *o;
  Expression *pEVar6;
  pool_ptr<soul::AST::Statement> local_138;
  pool_ptr<soul::AST::Statement> local_130;
  char *local_128;
  pool_ptr<soul::AST::Expression> local_120;
  Value local_118;
  Context local_d8;
  pool_ptr<soul::AST::Expression> local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  pool_ptr<soul::AST::VariableDeclaration> local_98;
  pool_ptr<soul::AST::VariableDeclaration> v;
  Statement *loopInitialiser;
  LoopStatement *local_68;
  LoopStatement *loopStatement;
  ScopedScope scope;
  void *local_40;
  Context local_38;
  Block *local_20;
  Block *block;
  StructuralParser *local_10;
  StructuralParser *this_local;
  
  block = (Block *)0x573c42;
  local_10 = this;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  getContext(&local_38,this);
  local_40 = (void *)0x0;
  pBVar2 = allocate<soul::AST::Block,soul::AST::Context,decltype(nullptr)>(this,&local_38,&local_40)
  ;
  AST::Context::~Context(&local_38);
  local_20 = pBVar2;
  ScopedScope::ScopedScope((ScopedScope *)&loopStatement,this,&pBVar2->super_Scope);
  getContext((Context *)&loopInitialiser,this);
  pLVar3 = allocate<soul::AST::LoopStatement,soul::AST::Context>(this,(Context *)&loopInitialiser);
  AST::Context::~Context((Context *)&loopInitialiser);
  local_68 = pLVar3;
  pSVar4 = parseStatement(this);
  AST::Block::addStatement(local_20,pSVar4);
  AST::Block::addStatement(local_20,&local_68->super_Statement);
  v.object = (VariableDeclaration *)0x571824;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x571824);
  if (bVar1) {
    cast<soul::AST::VariableDeclaration,soul::AST::Statement>((soul *)&local_98,pSVar4);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_98);
    if (bVar1) {
      (local_68->rangeLoopInitialiser).object = local_98.object;
      pVVar5 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_98);
      pVVar5->doNotConstantFold = true;
      local_a0 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         ::skip(&this->super_SOULTokeniser);
    }
    else {
      local_a8 = ";";
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
    }
    pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_98);
  }
  else {
    local_b0 = ";";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
    if (bVar1) {
      local_d8.location.sourceCode.object = (SourceCodeText *)0x0;
      local_d8.location.location.data = (char *)0x0;
      local_d8.parentScope = (Scope *)0x0;
      AST::Context::Context(&local_d8);
      soul::Value::Value(&local_118,true);
      o = allocate<soul::AST::Constant,soul::AST::Context,soul::Value>(this,&local_d8,&local_118);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Constant,void>(&local_b8,o);
      (local_68->condition).object = local_b8.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_b8);
      soul::Value::~Value(&local_118);
      AST::Context::~Context(&local_d8);
    }
    else {
      pEVar6 = parseExpression(this,false);
      pEVar6 = matchEndOfStatement<soul::AST::Expression>(this,pEVar6);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_120,pEVar6);
      (local_68->condition).object = local_120.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_120);
    }
    local_128 = ")";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
    if (!bVar1) {
      pEVar6 = parseExpression(this,true);
      pEVar6 = matchCloseParen(this,pEVar6);
      pool_ptr<soul::AST::Statement>::pool_ptr<soul::AST::Expression,void>(&local_130,pEVar6);
      (local_68->iterator).object = local_130.object;
      pool_ptr<soul::AST::Statement>::~pool_ptr(&local_130);
    }
  }
  pSVar4 = parseStatement(this);
  pool_ptr<soul::AST::Statement>::pool_ptr<soul::AST::Statement,void>(&local_138,pSVar4);
  (local_68->body).object = local_138.object;
  pool_ptr<soul::AST::Statement>::~pool_ptr(&local_138);
  pBVar2 = local_20;
  ScopedScope::~ScopedScope((ScopedScope *)&loopStatement);
  return &pBVar2->super_Statement;
}

Assistant:

AST::Statement& parseForLoop()
    {
        expect (Operator::openParen);
        auto& block = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, block);
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());
        auto& loopInitialiser = parseStatement();
        block.addStatement (loopInitialiser);
        block.addStatement (loopStatement);

        if (matches (Operator::closeParen))
        {
            if (auto v = cast<AST::VariableDeclaration> (loopInitialiser))
            {
                loopStatement.rangeLoopInitialiser = v;
                v->doNotConstantFold = true;
                skip();
            }
            else
            {
                expect (Operator::semicolon);
            }
        }
        else
        {
            if (matchIf (Operator::semicolon))
                loopStatement.condition = allocate<AST::Constant> (AST::Context(), Value (true));
            else
                loopStatement.condition = matchEndOfStatement (parseExpression());

            if (! matchIf (Operator::closeParen))
                loopStatement.iterator = matchCloseParen (parseExpression (true));
        }

        loopStatement.body = parseStatement();
        return block;
    }